

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUpdate(TgTypeParser *this,ptree *data)

{
  int iVar1;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  allocator local_59;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_58;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::make_shared<TgBot::Update>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_48,"update_id",0x2e);
  iVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&local_48);
  **(int **)this = iVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"message",&local_59);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 8),
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"edited_message",&local_59);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x18),
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"channel_post",&local_59);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x28),
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"edited_channel_post",&local_59);
  tryParseJson<TgBot::Message>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::Message>)data,
             (ptree *)parseJsonAndGetMessage,(string *)0x0);
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x38),
             &local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"inline_query",&local_59);
  tryParseJson<TgBot::InlineQuery>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::InlineQuery>)data,
             (ptree *)parseJsonAndGetInlineQuery,(string *)0x0);
  std::__shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2> *)(*(long *)this + 0x48),
             (__shared_ptr<TgBot::InlineQuery,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"chosen_inline_result",&local_59);
  tryParseJson<TgBot::ChosenInlineResult>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::ChosenInlineResult>)data,
             (ptree *)parseJsonAndGetChosenInlineResult,(string *)0x0);
  std::__shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x58),
             (__shared_ptr<TgBot::ChosenInlineResult,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"callback_query",&local_59);
  tryParseJson<TgBot::CallbackQuery>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::CallbackQuery>)data,
             (ptree *)parseJsonAndGetCallbackQuery,(string *)0x0);
  std::__shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x68),
             (__shared_ptr<TgBot::CallbackQuery,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"shipping_query",&local_59);
  tryParseJson<TgBot::ShippingQuery>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::ShippingQuery>)data,
             (ptree *)parseJsonAndGetShippingQuery,(string *)0x0);
  std::__shared_ptr<TgBot::ShippingQuery,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::ShippingQuery,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x78),
             (__shared_ptr<TgBot::ShippingQuery,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"pre_checkout_query",&local_59);
  tryParseJson<TgBot::PreCheckoutQuery>
            ((TgTypeParser *)&local_58,(JsonToTgTypeFunc<TgBot::PreCheckoutQuery>)data,
             (ptree *)parseJsonAndGetPreCheckoutQuery,(string *)0x0);
  std::__shared_ptr<TgBot::PreCheckoutQuery,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::PreCheckoutQuery,_(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)this + 0x88),
             (__shared_ptr<TgBot::PreCheckoutQuery,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)&local_48);
  PVar2.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::Update,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Update::Ptr TgTypeParser::parseJsonAndGetUpdate(const ptree& data) const {
    auto result(make_shared<Update>());
    result->updateId = data.get<int32_t>("update_id");
    result->message = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "message");
    result->editedMessage = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_message");
    result->channelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "channel_post");
    result->editedChannelPost = tryParseJson<Message>(&TgTypeParser::parseJsonAndGetMessage, data, "edited_channel_post");
    result->inlineQuery = tryParseJson<InlineQuery>(&TgTypeParser::parseJsonAndGetInlineQuery, data, "inline_query");
    result->chosenInlineResult = tryParseJson<ChosenInlineResult>(&TgTypeParser::parseJsonAndGetChosenInlineResult, data, "chosen_inline_result");
    result->callbackQuery = tryParseJson<CallbackQuery>(&TgTypeParser::parseJsonAndGetCallbackQuery, data, "callback_query");
    result->shippingQuery = tryParseJson<ShippingQuery>(&TgTypeParser::parseJsonAndGetShippingQuery, data, "shipping_query");
    result->preCheckoutQuery = tryParseJson<PreCheckoutQuery>(&TgTypeParser::parseJsonAndGetPreCheckoutQuery, data, "pre_checkout_query");
    return result;
}